

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive_buffer.cpp
# Opt level: O0

void __thiscall libtorrent::aux::receive_buffer::reset(receive_buffer *this,int packet_size)

{
  int packet_size_local;
  receive_buffer *this_local;
  
  if (this->m_packet_size < this->m_recv_end) {
    cut(this,this->m_packet_size,packet_size,0);
  }
  else {
    this->m_recv_pos = 0;
    this->m_recv_start = 0;
    this->m_recv_end = 0;
    this->m_packet_size = packet_size;
  }
  return;
}

Assistant:

void receive_buffer::reset(int const packet_size)
{
	INVARIANT_CHECK;
	TORRENT_ASSERT(int(m_recv_buffer.size()) >= m_recv_end);
	TORRENT_ASSERT(packet_size > 0);
	if (m_recv_end > m_packet_size)
	{
		cut(m_packet_size, packet_size);
		return;
	}

	m_recv_pos = 0;
	m_recv_start = 0;
	m_recv_end = 0;
	m_packet_size = packet_size;
}